

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::TimeType::TimeType(TimeType *this,TimeType *other44)

{
  TimeUnit *in_RSI;
  TimeUnit *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__TimeType_03540178;
  *(undefined ***)in_RDI = &PTR__TimeType_03540178;
  TimeUnit::TimeUnit(in_RSI);
  *(byte *)&in_RDI->MILLIS = *(byte *)&in_RSI->MILLIS & 1;
  TimeUnit::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

TimeType::TimeType(const TimeType& other44) noexcept {
  isAdjustedToUTC = other44.isAdjustedToUTC;
  unit = other44.unit;
}